

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

XMLElement * __thiscall tinyxml2::XMLDocument::NewElement(XMLDocument *this,char *name)

{
  XMLElement *pXVar1;
  
  pXVar1 = (XMLElement *)MemPoolT<104>::Alloc(&this->_elementPool);
  (pXVar1->super_XMLNode)._document = this;
  (pXVar1->super_XMLNode)._parent = (XMLNode *)0x0;
  (pXVar1->super_XMLNode)._value._flags = 0;
  (pXVar1->super_XMLNode)._value._start = (char *)0x0;
  (pXVar1->super_XMLNode)._value._end = (char *)0x0;
  (pXVar1->super_XMLNode)._firstChild = (XMLNode *)0x0;
  (pXVar1->super_XMLNode)._lastChild = (XMLNode *)0x0;
  (pXVar1->super_XMLNode)._prev = (XMLNode *)0x0;
  (pXVar1->super_XMLNode)._next = (XMLNode *)0x0;
  (pXVar1->super_XMLNode)._vptr_XMLNode = (_func_int **)&PTR_ToElement_002287d0;
  pXVar1->_closingType = 0;
  pXVar1->_rootAttribute = (XMLAttribute *)0x0;
  (pXVar1->super_XMLNode)._memPool = &(this->_elementPool).super_MemPool;
  StrPair::SetStr(&(pXVar1->super_XMLNode)._value,name,0);
  return pXVar1;
}

Assistant:

XMLElement* XMLDocument::NewElement( const char* name )
{
    TIXMLASSERT( sizeof( XMLElement ) == _elementPool.ItemSize() );
    XMLElement* ele = new (_elementPool.Alloc()) XMLElement( this );
    ele->_memPool = &_elementPool;
    ele->SetName( name );
    return ele;
}